

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevolute.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkRevolute::Initialize
          (ChLinkRevolute *this,shared_ptr<chrono::ChBody> *body1,shared_ptr<chrono::ChBody> *body2,
          bool local,ChFrame<double> *frame1,ChFrame<double> *frame2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  element_type *peVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined7 in_register_00000009;
  ChBodyFrame *pCVar11;
  ChBodyFrame *pCVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  ChFrame<double> local_1c8;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  peVar6 = (body1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar12 = &peVar6->super_ChBodyFrame;
  if (peVar6 == (element_type *)0x0) {
    pCVar12 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body1 = pCVar12;
  peVar6 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar11 = &peVar6->super_ChBodyFrame;
  if (peVar6 == (element_type *)0x0) {
    pCVar11 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body2 = pCVar11;
  iVar9 = (*(pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar10 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_x,(ChVariables *)CONCAT44(extraout_var,iVar9),
             (ChVariables *)CONCAT44(extraout_var_00,iVar10));
  iVar9 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar10 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_y,(ChVariables *)CONCAT44(extraout_var_01,iVar9),
             (ChVariables *)CONCAT44(extraout_var_02,iVar10));
  iVar9 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar10 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_z,(ChVariables *)CONCAT44(extraout_var_03,iVar9),
             (ChVariables *)CONCAT44(extraout_var_04,iVar10));
  iVar9 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar10 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_uw,(ChVariables *)CONCAT44(extraout_var_05,iVar9),
             (ChVariables *)CONCAT44(extraout_var_06,iVar10));
  iVar9 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar10 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_vw,(ChVariables *)CONCAT44(extraout_var_07,iVar9),
             (ChVariables *)CONCAT44(extraout_var_08,iVar10));
  local_140._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_140.coord.pos.m_data[0] = 0.0;
  local_140.coord.pos.m_data[1] = 0.0;
  local_140.coord.pos.m_data[2] = 0.0;
  local_1c8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_1c8.coord.pos.m_data[0] = 0.0;
  local_1c8.coord.pos.m_data[1] = 0.0;
  local_1c8.coord.pos.m_data[2] = 0.0;
  local_1c8.coord.rot.m_data[0] = 1.0;
  local_1c8.coord.rot.m_data[1] = 0.0;
  local_1c8.coord.rot.m_data[2] = 0.0;
  local_1c8.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_1c8.Amatrix,(ChQuaternion<double> *)&local_140);
  local_140._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_140.coord.pos.m_data[2] = 0.0;
  local_b8._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_140.coord.pos.m_data[0] = 0.0;
  local_140.coord.pos.m_data[1] = 0.0;
  local_140.coord.rot.m_data[0] = 1.0;
  local_b8.coord.pos.m_data[0] = 0.0;
  local_b8.coord.pos.m_data[1] = 0.0;
  local_b8.coord.pos.m_data[2] = 0.0;
  local_140.coord.rot.m_data[1] = 0.0;
  local_140.coord.rot.m_data[2] = 0.0;
  local_140.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_140.Amatrix,(ChQuaternion<double> *)&local_b8);
  if ((int)CONCAT71(in_register_00000009,local) == 0) {
    ChFrame<double>::TransformParentToLocal
              ((ChFrame<double> *)(this->super_ChLink).Body1,frame1,&this->m_frame1);
    ChFrame<double>::TransformParentToLocal
              ((ChFrame<double> *)(this->super_ChLink).Body2,frame2,&this->m_frame2);
    if (&local_1c8 != frame1) {
      local_1c8.coord.pos.m_data[0] = (frame1->coord).pos.m_data[0];
      local_1c8.coord.pos.m_data[1] = (frame1->coord).pos.m_data[1];
      local_1c8.coord.pos.m_data[2] = (frame1->coord).pos.m_data[2];
      local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (frame1->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (frame1->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           (frame1->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           (frame1->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           (frame1->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           (frame1->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    }
    if (&local_140 == frame2) {
      auVar13._8_8_ = local_140.coord.pos.m_data[1];
      auVar13._0_8_ = local_140.coord.pos.m_data[0];
      local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_140.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_140.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      local_b8.coord.pos.m_data[2] = local_140.coord.pos.m_data[2];
    }
    else {
      auVar13 = *(undefined1 (*) [16])(frame2->coord).pos.m_data;
      local_b8.coord.pos.m_data[2] = (frame2->coord).pos.m_data[2];
      local_140.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           (frame2->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           (frame2->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           (frame2->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    }
  }
  else {
    ChFrame<double>::operator=(&this->m_frame1,frame1);
    ChFrame<double>::operator=(&this->m_frame2,frame2);
    ChFrame<double>::operator>>(&local_b8,frame1,(ChFrame<double> *)(this->super_ChLink).Body1);
    local_1c8.coord.pos.m_data[0] = local_b8.coord.pos.m_data[0];
    local_1c8.coord.pos.m_data[1] = local_b8.coord.pos.m_data[1];
    local_1c8.coord.pos.m_data[2] = local_b8.coord.pos.m_data[2];
    local_1c8.coord.rot.m_data[0] = local_b8.coord.rot.m_data[0];
    local_1c8.coord.rot.m_data[1] = local_b8.coord.rot.m_data[1];
    local_1c8.coord.rot.m_data[2] = local_b8.coord.rot.m_data[2];
    local_1c8.coord.rot.m_data[3] = local_b8.coord.rot.m_data[3];
    local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    ChFrame<double>::operator>>(&local_b8,frame2,(ChFrame<double> *)(this->super_ChLink).Body2);
    auVar13._8_8_ = local_b8.coord.pos.m_data[1];
    auVar13._0_8_ = local_b8.coord.pos.m_data[0];
    local_140.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  }
  dVar1 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1;
  dVar2 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar2;
  dVar3 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar3;
  dVar4 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar4;
  dVar5 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar5;
  auVar15._8_8_ =
       local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar15._0_8_ =
       local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar20._0_8_ = -dVar1;
  auVar20._8_8_ = 0x8000000000000000;
  auVar34._0_8_ = -dVar2;
  auVar34._8_8_ = 0x8000000000000000;
  auVar7 = vunpcklpd_avx(auVar29,auVar16);
  auVar30._0_8_ = -dVar3;
  auVar30._8_8_ = 0x8000000000000000;
  auVar21 = vpslldq_avx(auVar20,8);
  auVar8 = vunpcklpd_avx(auVar30,auVar24);
  auVar35 = vpslldq_avx(auVar34,8);
  auVar31._0_8_ = -dVar5;
  auVar31._8_8_ = 0x8000000000000000;
  *(undefined1 (*) [16])
   (this->m_u1_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array = auVar21;
  *(undefined1 (*) [16])
   ((this->m_u1_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 2) =
       auVar7;
  *(undefined1 (*) [16])
   ((this->m_u1_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 4) =
       auVar35;
  *(undefined1 (*) [16])
   ((this->m_u1_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 6) =
       auVar8;
  (this->m_u1_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  auVar25._0_8_ = -dVar4;
  auVar25._8_8_ = 0x8000000000000000;
  auVar7 = vunpcklpd_avx(auVar31,auVar27);
  dVar1 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar1;
  auVar35 = vpslldq_avx(auVar25,8);
  auVar22._0_8_ = -dVar1;
  auVar22._8_8_ = 0x8000000000000000;
  auVar8 = vunpcklpd_avx(auVar33,auVar17);
  auVar21 = vpslldq_avx(auVar22,8);
  *(undefined1 (*) [16])
   (this->m_v1_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array = auVar21;
  *(undefined1 (*) [16])
   ((this->m_v1_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 2) =
       auVar8;
  *(undefined1 (*) [16])
   ((this->m_v1_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 4) =
       auVar35;
  *(undefined1 (*) [16])
   ((this->m_v1_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 6) =
       auVar7;
  (this->m_v1_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  dVar1 = (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar1;
  dVar2 = (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar2;
  dVar3 = (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar3;
  auVar23._0_8_ = -dVar1;
  auVar23._8_8_ = 0x8000000000000000;
  auVar32._0_8_ = -dVar2;
  auVar32._8_8_ = 0x8000000000000000;
  auVar19._0_8_ = -dVar3;
  auVar19._8_8_ = 0x8000000000000000;
  auVar7 = vunpcklpd_avx(auVar26,auVar18);
  auVar21 = vpslldq_avx(auVar23,8);
  auVar35 = vpslldq_avx(auVar32,8);
  auVar8 = vunpcklpd_avx(auVar19,auVar28);
  *(undefined1 (*) [16])
   (this->m_w2_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array = auVar21;
  *(undefined1 (*) [16])
   ((this->m_w2_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 2) =
       auVar7;
  *(undefined1 (*) [16])
   ((this->m_w2_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 4) =
       auVar35;
  *(undefined1 (*) [16])
   ((this->m_w2_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 6) =
       auVar8;
  (this->m_w2_tilde).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  auVar8._8_8_ = local_1c8.coord.pos.m_data[1];
  auVar8._0_8_ = local_1c8.coord.pos.m_data[0];
  auVar13 = vsubpd_avx(auVar13,auVar8);
  *(undefined1 (*) [16])
   (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array =
       auVar13;
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[2]
       = local_b8.coord.pos.m_data[2] - local_1c8.coord.pos.m_data[2];
  auVar14._0_8_ =
       local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar14._8_8_ =
       local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar35._8_8_ =
       local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar35._0_8_ =
       local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar21._8_8_ =
       local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar21._0_8_ =
       local_1c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar13 = vfmadd132pd_fma(auVar15,auVar14,auVar21);
  auVar7._8_8_ = local_140.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar7._0_8_ = local_140.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar13 = vfmadd231pd_avx512vl(auVar13,auVar35,auVar7);
  *(undefined1 (*) [16])
   ((this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
   + 3) = auVar13;
  return;
}

Assistant:

void ChLinkRevolute::Initialize(std::shared_ptr<ChBody> body1,
                                std::shared_ptr<ChBody> body2,
                                bool local,
                                const ChFrame<>& frame1,
                                const ChFrame<>& frame2) {
    Body1 = body1.get();
    Body2 = body2.get();

    m_cnstr_x.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_y.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_z.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_uw.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_vw.SetVariables(&Body1->Variables(), &Body2->Variables());

    ChFrame<> frame1_abs;
    ChFrame<> frame2_abs;

    if (local) {
        m_frame1 = frame1;
        m_frame2 = frame2;
        frame1_abs = frame1 >> *Body1;
        frame2_abs = frame2 >> *Body2;
    } else {
        ((ChFrame<>*)Body1)->TransformParentToLocal(frame1, m_frame1);
        ((ChFrame<>*)Body2)->TransformParentToLocal(frame2, m_frame2);
        frame1_abs = frame1;
        frame2_abs = frame2;
    }

    m_u1_tilde = ChStarMatrix33<>(m_frame1.GetA().Get_A_Xaxis());
    m_v1_tilde = ChStarMatrix33<>(m_frame1.GetA().Get_A_Yaxis());
    m_w2_tilde = ChStarMatrix33<>(m_frame2.GetA().Get_A_Zaxis());

    m_C(0) = frame2_abs.coord.pos.x() - frame1_abs.coord.pos.x();
    m_C(1) = frame2_abs.coord.pos.y() - frame1_abs.coord.pos.y();
    m_C(2) = frame2_abs.coord.pos.z() - frame1_abs.coord.pos.z();
    m_C(3) = Vdot(frame1_abs.GetA().Get_A_Xaxis(), frame2_abs.GetA().Get_A_Zaxis());
    m_C(4) = Vdot(frame1_abs.GetA().Get_A_Yaxis(), frame2_abs.GetA().Get_A_Zaxis());
}